

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
begin_property_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  bool bVar1;
  QDebug *pQVar2;
  string *s;
  initializer_list<char> __l;
  allocator_type local_79;
  _Vector_base<char,_std::allocator<char>_> local_78;
  char local_5a [2];
  string local_58;
  string property_name;
  
  property_name._M_dataplus._M_p = (pointer)&property_name.field_2;
  property_name._M_string_length = 0;
  property_name.field_2._M_local_buf[0] = '\0';
  clear_empty(f);
  anon_unknown.dwarf_1f3b3::trim
            ((anon_unknown_dwarf_1f3b3 *)&(anonymous_namespace)::global_string_abi_cxx11_,
             (string *)conf);
  std::make_shared<MetaProperty>();
  std::__shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2> *)
             &(anonymous_namespace)::current_property,
             (__shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(anonymous_namespace)::global_string_abi_cxx11_,"enum");
  if (bVar1) {
    *(undefined1 *)&(anonymous_namespace)::current_property[10]._M_ptr = 1;
    std::operator>>((istream *)f,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_58._M_dataplus._M_p._0_4_ = 2;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_58.field_2._M_allocated_capacity._4_4_ = 0;
      local_58.field_2._8_8_ = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<((QDebug *)&local_78,"Enum with type");
      operator<<(pQVar2,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
      QDebug::~QDebug((QDebug *)&local_78);
    }
  }
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 5));
  std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((anonymous_namespace)::current_property,
             (__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
             &(anonymous_namespace)::current_class);
  DAT_00113318 = 0;
  *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
  local_5a[0] = '=';
  local_5a[1] = '\n';
  __l._M_len = 2;
  __l._M_array = local_5a;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_78,__l,&local_79);
  read_untill_delimiters_abi_cxx11_(&local_58,f,(vector<char,_std::allocator<char>_> *)&local_78);
  s = &local_58;
  std::__cxx11::string::operator=((string *)&property_name,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_78);
  anon_unknown.dwarf_1f3b3::trim((anon_unknown_dwarf_1f3b3 *)&property_name,s);
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 1));
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_58._M_dataplus._M_p._0_4_ = 2;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_58.field_2._M_allocated_capacity._4_4_ = 0;
    local_58.field_2._8_8_ = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)&local_78,"Starting property ");
    pQVar2 = operator<<(pQVar2,&property_name);
    QDebug::operator<<(pQVar2," ");
    QDebug::~QDebug((QDebug *)&local_78);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = property_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  std::__cxx11::string::~string((string *)&property_name);
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_property_state(MetaConfiguration &conf, std::ifstream &f,
                                int &error) {
  // here we know that we have at least the type of the property,
  // but it can be three kinds of string.

  std::string property_name;
  clear_empty(f);

  trim(global_string);
  current_property = std::make_shared<MetaProperty>();

  if (global_string == "enum") {
    current_property->is_enum = true;
    f >> global_string;
    qCDebug(parser) << "Enum with type" << global_string;
  }

  current_property->type = global_string;
  current_property->parent = current_class;
  global_string.clear();

  // find the name of the property
  property_name = read_untill_delimiters(f, {'=', '\n'});
  trim(property_name);
  current_property->name = property_name;
  qCDebug(parser) << "Starting property " << property_name << " ";
  return property_state;
}